

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void __thiscall btLCP::solve1(btLCP *this,btScalar *a,int i,int dir,int only_transfer)

{
  int iVar1;
  int *piVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  int *C;
  btScalar *pbVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = this->m_nC;
  if (0 < (long)iVar1) {
    pbVar5 = this->m_Dell;
    piVar2 = this->m_C;
    pbVar3 = this->m_A[i];
    uVar6 = this->m_nub;
    if ((long)(int)uVar6 < 1) {
      uVar6 = 0;
    }
    else {
      lVar9 = 0;
      do {
        pbVar5[lVar9] = pbVar3[lVar9];
        lVar9 = lVar9 + 1;
      } while ((int)uVar6 != lVar9);
    }
    if ((int)uVar6 < iVar1) {
      uVar7 = (ulong)uVar6;
      do {
        pbVar5[uVar7] = pbVar3[piVar2[uVar7]];
        uVar7 = uVar7 + 1;
      } while ((long)iVar1 != uVar7);
    }
    btSolveL1(this->m_L,pbVar5,iVar1,this->m_nskip);
    iVar1 = this->m_nC;
    lVar9 = (long)iVar1;
    if (lVar9 < 1) {
      if (only_transfer != 0) {
        return;
      }
      pbVar5 = this->m_tmp;
    }
    else {
      pbVar3 = this->m_ell;
      pbVar5 = this->m_d;
      pbVar4 = this->m_Dell;
      lVar8 = 0;
      do {
        pbVar3[lVar8] = pbVar4[lVar8] * pbVar5[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
      if (only_transfer != 0) {
        return;
      }
      pbVar5 = this->m_tmp;
      if (0 < iVar1) {
        lVar8 = 0;
        do {
          pbVar5[lVar8] = pbVar3[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
    }
    btSolveL1T(this->m_L,pbVar5,iVar1,this->m_nskip);
    piVar2 = this->m_C;
    pbVar5 = this->m_tmp;
    uVar6 = this->m_nC;
    if (dir < 1) {
      if (0 < (int)uVar6) {
        uVar7 = 0;
        do {
          a[piVar2[uVar7]] = pbVar5[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
    }
    else if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        a[piVar2[uVar7]] = -pbVar5[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  return;
}

Assistant:

void btLCP::solve1 (btScalar *a, int i, int dir, int only_transfer)
{
  // the `Dell' and `ell' that are computed here are saved. if index i is
  // later added to the factorization then they can be reused.
  //
  // @@@ question: do we need to solve for entire delta_x??? yes, but
  //     only if an x goes below 0 during the step.

  if (m_nC > 0) {
    {
      btScalar *Dell = m_Dell;
      int *C = m_C;
      btScalar *aptr = BTAROW(i);
#   ifdef BTNUB_OPTIMIZATIONS
      // if nub>0, initial part of aptr[] is guaranteed unpermuted
      const int nub = m_nub;
      int j=0;
      for ( ; j<nub; ++j) Dell[j] = aptr[j];
      const int nC = m_nC;
      for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
    }
    btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
    {
      btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) ell[j] = Dell[j] * d[j];
    }

    if (!only_transfer) {
      btScalar *tmp = m_tmp, *ell = m_ell;
      {
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) tmp[j] = ell[j];
      }
      btSolveL1T (m_L,tmp,m_nC,m_nskip);
      if (dir > 0) {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = -tmp[j];
      } else {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = tmp[j];
      }
    }
  }
}